

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_yield(lua_State *L,int nresults)

{
  uint64_t uVar1;
  TValue *pTVar2;
  uint *puVar3;
  TValue TVar4;
  TValue *top;
  TValue *t;
  cTValue *f;
  global_State *g;
  void *cf;
  int nresults_local;
  lua_State *L_local;
  
  uVar1 = (L->glref).ptr64;
  if (((ulong)L->cframe & 1) == 0) {
    lj_err_msg(L,LJ_ERR_CYIELD);
  }
  puVar3 = (uint *)((ulong)L->cframe & 0xfffffffffffffffc);
  if ((*(byte *)(uVar1 + 0x91) & 0x10) == 0) {
    if (L->base < L->top + -(long)nresults) {
      top = L->base;
      t = L->top + -(long)nresults;
      cf._4_4_ = nresults;
      while (cf._4_4_ = cf._4_4_ + -1, -1 < cf._4_4_) {
        *top = *t;
        top = top + 1;
        t = t + 1;
      }
      L->top = top;
    }
    L->cframe = (void *)0x0;
    L->status = '\x01';
    return -1;
  }
  pTVar2 = L->top;
  *(byte *)(uVar1 + 0x91) = *(byte *)(uVar1 + 0x91) & 0xef;
  TVar4.field_4.it = 0;
  TVar4.field_4.i = *puVar3;
  *pTVar2 = TVar4;
  pTVar2[1].n = (lua_Number)lj_cont_hook;
  pTVar2[2].u64 = *(long *)(puVar3 + 6) - 4;
  pTVar2[3].u64 = (ulong)L | 0xfffc800000000000;
  pTVar2[4].u64 = (long)(pTVar2 + 4) + (10 - (long)L->base);
  L->base = pTVar2 + 5;
  L->top = pTVar2 + 5;
  lj_err_throw(L,1);
}

Assistant:

LUA_API int lua_yield(lua_State *L, int nresults)
{
  void *cf = L->cframe;
  global_State *g = G(L);
  if (cframe_canyield(cf)) {
    cf = cframe_raw(cf);
    if (!hook_active(g)) {  /* Regular yield: move results down if needed. */
      cTValue *f = L->top - nresults;
      if (f > L->base) {
	TValue *t = L->base;
	while (--nresults >= 0) copyTV(L, t++, f++);
	L->top = t;
      }
      L->cframe = NULL;
      L->status = LUA_YIELD;
      return -1;
    } else {  /* Yield from hook: add a pseudo-frame. */
      TValue *top = L->top;
      hook_leave(g);
      (top++)->u64 = cframe_multres(cf);
      setcont(top, lj_cont_hook);
      if (LJ_FR2) top++;
      setframe_pc(top, cframe_pc(cf)-1);
      top++;
      setframe_gc(top, obj2gco(L), LJ_TTHREAD);
      if (LJ_FR2) top++;
      setframe_ftsz(top, ((char *)(top+1)-(char *)L->base)+FRAME_CONT);
      L->top = L->base = top+1;
#if ((defined(__GNUC__) || defined(__clang__)) && (LJ_TARGET_X64 || defined(LUAJIT_UNWIND_EXTERNAL)) && !LJ_NO_UNWIND) || LJ_TARGET_WINDOWS
      lj_err_throw(L, LUA_YIELD);
#else
      L->cframe = NULL;
      L->status = LUA_YIELD;
      lj_vm_unwind_c(cf, LUA_YIELD);
#endif
    }
  }
  lj_err_msg(L, LJ_ERR_CYIELD);
  return 0;  /* unreachable */
}